

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatVec.c
# Opt level: O0

Msat_IntVec_t * Msat_IntVecDupArray(Msat_IntVec_t *pVec)

{
  Msat_IntVec_t *pMVar1;
  Msat_IntVec_t *p;
  Msat_IntVec_t *pVec_local;
  
  pMVar1 = (Msat_IntVec_t *)malloc(0x10);
  pMVar1->nSize = pVec->nSize;
  pMVar1->nCap = pVec->nCap;
  pMVar1->pArray = pVec->pArray;
  pVec->nSize = 0;
  pVec->nCap = 0;
  pVec->pArray = (int *)0x0;
  return pMVar1;
}

Assistant:

Msat_IntVec_t * Msat_IntVecDupArray( Msat_IntVec_t * pVec )
{
    Msat_IntVec_t * p;
    p = ABC_ALLOC( Msat_IntVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = pVec->pArray;
    pVec->nSize  = 0;
    pVec->nCap   = 0;
    pVec->pArray = NULL;
    return p;
}